

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

char * normal_skipS(ENCODING *enc,char *ptr)

{
  uint uVar1;
  byte *local_18;
  char *ptr_local;
  ENCODING *enc_local;
  
  local_18 = (byte *)ptr;
  while ((uVar1 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_18), uVar1 - 9 < 2 ||
         (uVar1 == 0x15))) {
    local_18 = local_18 + 1;
  }
  return (char *)local_18;
}

Assistant:

PREFIX(skipS)(const ENCODING *enc, const char *ptr) {
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_LF:
    case BT_CR:
    case BT_S:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr;
    }
  }
}